

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCodabarReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::CodabarReader::decodePattern
          (Barcode *__return_storage_ptr__,CodabarReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  Iterator puVar1;
  bool bVar2;
  int xStart;
  int iVar3;
  string txt;
  Error local_80;
  string local_50 [32];
  
  FindLeftGuard<7,bool(*)(ZXing::PatternView_const&,int)>
            ((PatternView *)&txt,(ZXing *)next,(PatternView *)0x1c,0x16dc20,
             (_func_bool_PatternView_ptr_int *)param_3);
  next->_base = (Iterator)
                CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]);
  next->_end = (Iterator)txt.field_2._8_8_;
  next->_data = (Iterator)txt._M_dataplus._M_p;
  *(size_type *)&next->_size = txt._M_string_length;
  bVar2 = PatternView::isValid(next);
  if (!bVar2) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  xStart = PatternView::pixelsInFront(next);
  iVar3 = PatternView::sum(next,0);
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  RowReader::DecodeNarrowWidePattern<int[20],char[21]>
            (next,(int (*) [20])CHARACTER_ENCODINGS,(char (*) [21])ALPHABET);
  std::__cxx11::string::push_back((char)&txt);
  if ((byte)(txt._M_dataplus._M_p[txt._M_string_length - 1] + 0xbfU) < 4) {
    do {
      if (((next->_data == (Iterator)0x0) ||
          (puVar1 = next->_data + next->_size, next->_data = puVar1,
          next->_end < puVar1 + next->_size)) ||
         (bVar2 = PatternView::skipSingle(next,iVar3 / 2), !bVar2)) goto LAB_0016ded3;
      RowReader::DecodeNarrowWidePattern<int[20],char[21]>
                (next,(int (*) [20])CHARACTER_ENCODINGS,(char (*) [21])ALPHABET);
      std::__cxx11::string::push_back((char)&txt);
      if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0016ded3;
    } while (3 < (byte)(txt._M_dataplus._M_p[txt._M_string_length - 1] + 0xbfU));
    if ((3 < (int)txt._M_string_length) &&
       (bVar2 = PatternView::hasQuietZoneAfter<true>(next,0.5), bVar2)) {
      if ((((this->super_RowReader)._opts)->field_0x1 & 1) == 0) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&txt);
        std::__cxx11::string::operator=((string *)&txt,local_50);
        std::__cxx11::string::~string(local_50);
      }
      iVar3 = PatternView::pixelsTillEnd(next);
      local_80._msg._M_dataplus._M_p = (pointer)&local_80._msg.field_2;
      local_80._msg.field_2._M_allocated_capacity = 0;
      local_80._msg.field_2._8_8_ = 0;
      local_80._msg._M_string_length = 0;
      local_80._file = (char *)0x0;
      local_80._line = -1;
      local_80._type = None;
      local_80._43_5_ = 0;
      Result::Result(__return_storage_ptr__,&txt,rowNumber,xStart,iVar3,Codabar,
                     (SymbologyIdentifier)0x3046,&local_80,false);
      std::__cxx11::string::~string((string *)&local_80);
      goto LAB_0016deea;
    }
  }
LAB_0016ded3:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_0016deea:
  std::__cxx11::string::~string((string *)&txt);
  return __return_storage_ptr__;
}

Assistant:

Barcode CodabarReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop and checksum characters)
	// absolute minimum would be 2 (meaning 0 'content'). everything below 4 produces too many false
	// positives.
	const int minCharCount = 4;
	auto isStartOrStopSymbol = [](char c) { return 'A' <= c && c <= 'D'; };

	next = FindLeftGuard<CHAR_LEN>(next, minCharCount * CHAR_LEN, IsLeftGuard);
	if (!next.isValid())
		return {};

	int xStart = next.pixelsInFront();
	int maxInterCharacterSpace = next.sum() / 2; // spec actually says 1 narrow space, width/2 is about 4

	std::string txt;
	txt.reserve(20);
	txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET); // read off the start pattern

	if (!isStartOrStopSymbol(txt.back()))
		return {};

	do {
		// check remaining input width and inter-character space
		if (!next.skipSymbol() || !next.skipSingle(maxInterCharacterSpace))
			return {};

		txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (!isStartOrStopSymbol(txt.back()));

	// next now points to the last decoded symbol
	// check txt length and whitespace after the last char. See also FindStartPattern.
	if (Size(txt) < minCharCount || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	// remove stop/start characters
	if (!_opts.returnCodabarStartEnd())
		txt = txt.substr(1, txt.size() - 2);

	// symbology identifier ISO/IEC 15424:2008 4.4.9
	// if checksum processing were implemented and checksum present and stripped then modifier would be 4
	SymbologyIdentifier symbologyIdentifier = {'F', '0'};

	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::Codabar, symbologyIdentifier);
}